

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O2

QVariant * __thiscall
QSpinBoxPrivate::validateAndInterpret
          (QVariant *__return_storage_ptr__,QSpinBoxPrivate *this,QString *input,int *pos,
          State *state)

{
  QString *s1;
  QLocale *this_00;
  undefined1 *puVar1;
  PrivateShared *pPVar2;
  char16_t *pcVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  State SVar9;
  QVariant *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  bool ok;
  QArrayDataPointer<char16_t> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  s1 = &(this->super_QAbstractSpinBoxPrivate).cachedText;
  bVar4 = ::comparesEqual(s1,input);
  if ((bVar4) && ((input->d).size != 0)) {
    *state = (this->super_QAbstractSpinBoxPrivate).cachedState;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      ::QVariant::QVariant
                (__return_storage_ptr__,&(this->super_QAbstractSpinBoxPrivate).cachedValue);
      return __return_storage_ptr__;
    }
    goto LAB_00443612;
  }
  iVar6 = ::QVariant::toInt((bool *)&(this->super_QAbstractSpinBoxPrivate).maximum);
  iVar7 = ::QVariant::toInt((bool *)&(this->super_QAbstractSpinBoxPrivate).minimum);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractSpinBoxPrivate::stripped
            ((QString *)&local_78,&this->super_QAbstractSpinBoxPrivate,input,pos);
  *state = Acceptable;
  if (iVar6 == iVar7) {
LAB_004432fb:
    cVar5 = QString::startsWith((QChar)(char16_t)&local_78,0x2d);
    if ((-1 < iVar7) && (SVar9 = Invalid, cVar5 != '\0')) goto LAB_004434c2;
    ok = false;
    iVar8 = *(int *)&(this->super_QAbstractSpinBoxPrivate).field_0x3d4;
    if (iVar8 == 10) {
      this_00 = &(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.locale;
      iVar8 = QLocale::toInt(this_00,(QString *)&local_78,&ok);
      if ((ok == false) && (999 < iVar6 || iVar7 < -999)) {
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QLocale::groupSeparator();
        local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_b0.d = (Data *)&local_58;
        local_b0.ptr = (char16_t *)local_b0.d;
        QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                  ((QString *)&local_98,
                   (QStringBuilder<const_QString_&,_const_QString_&> *)&local_b0);
        bVar4 = QString::contains((QString *)&local_78,(QString *)&local_58,CaseSensitive);
        if ((bVar4) &&
           (bVar4 = QString::contains((QString *)&local_78,(QString *)&local_98,CaseSensitive),
           !bVar4)) {
          local_b0.d = local_78.d;
          local_b0.ptr = local_78.ptr;
          local_b0.size = local_78.size;
          if ((anon_union_24_3_e3d07ef4_for_data *)local_78.d !=
              (anon_union_24_3_e3d07ef4_for_data *)0x0) {
            LOCK();
            *(int *)local_78.d = *(int *)local_78.d + 1;
            UNLOCK();
          }
          QString::remove((QString *)&local_b0,(CaseSensitivity)&local_58);
          iVar8 = QLocale::toInt(this_00,(QString *)&local_b0,&ok);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      }
    }
    else {
      iVar8 = QString::toInt((QString *)&local_78,&ok,iVar8);
    }
    SVar9 = Invalid;
    if (ok != true) {
LAB_00443520:
      *state = SVar9;
      goto LAB_00443523;
    }
    if (iVar8 < iVar7 || iVar6 < iVar8) {
      if (iVar6 != iVar7) {
        SVar9 = (State)((-1 < iVar8 || iVar7 <= iVar8) && (-1 >= iVar8 || iVar8 <= iVar6));
      }
      goto LAB_00443520;
    }
    *state = Acceptable;
    iVar7 = iVar8;
  }
  else {
    if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
      if (iVar7 < 0) {
        local_58._forAlignment = 4.94065645841247e-324;
        local_58._8_8_ = (long)"$qt_ia-" + 6;
        bVar4 = ::operator==((QString *)&local_78,(QLatin1StringView *)&local_58);
        if (bVar4) goto LAB_004434bf;
      }
      if (-1 < iVar6) {
        local_98.d = (Data *)0x1;
        local_98.ptr = L"+";
        bVar4 = ::operator==((QString *)&local_78,(QLatin1StringView *)&local_98);
        if (bVar4) goto LAB_004434bf;
      }
      goto LAB_004432fb;
    }
LAB_004434bf:
    SVar9 = Intermediate;
LAB_004434c2:
    *state = SVar9;
LAB_00443523:
    if (iVar6 < 1) {
      iVar7 = iVar6;
    }
  }
  local_98.d = (Data *)&(this->super_QAbstractSpinBoxPrivate).prefix;
  local_98.size = (qsizetype)&(this->super_QAbstractSpinBoxPrivate).suffix;
  local_98.ptr = (char16_t *)&local_78;
  QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&>::convertTo<QString>
            ((QString *)&local_58,
             (QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&> *)
             &local_98);
  pPVar2 = (PrivateShared *)(input->d).d;
  pcVar3 = (input->d).ptr;
  (input->d).d = (Data *)local_58.shared;
  (input->d).ptr = (char16_t *)local_58._8_8_;
  puVar1 = (undefined1 *)(input->d).size;
  (input->d).size = local_58._16_8_;
  local_58.shared = pPVar2;
  local_58._8_8_ = pcVar3;
  local_58._16_8_ = puVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QString::operator=(s1,(QString *)input);
  (this->super_QAbstractSpinBoxPrivate).cachedState = *state;
  ::QVariant::QVariant((QVariant *)&local_58,iVar7);
  this_01 = &(this->super_QAbstractSpinBoxPrivate).cachedValue;
  ::QVariant::operator=(this_01,(QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  ::QVariant::QVariant(__return_storage_ptr__,this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00443612:
  __stack_chk_fail();
}

Assistant:

QVariant QSpinBoxPrivate::validateAndInterpret(QString &input, int &pos,
                                               QValidator::State &state) const
{
    if (cachedText == input && !input.isEmpty()) {
        state = cachedState;
        QSBDEBUG() << "cachedText was '" << cachedText << "' state was "
                   << state << " and value was " << cachedValue;

        return cachedValue;
    }
    const int max = maximum.toInt();
    const int min = minimum.toInt();

    QString copy = stripped(input, &pos);
    QSBDEBUG() << "input" << input << "copy" << copy;
    state = QValidator::Acceptable;
    int num = min;

    if (max != min && (copy.isEmpty()
                       || (min < 0 && copy == "-"_L1)
                       || (max >= 0 && copy == "+"_L1))) {
        state = QValidator::Intermediate;
        QSBDEBUG() << __FILE__ << __LINE__<< "num is set to" << num;
    } else if (copy.startsWith(u'-') && min >= 0) {
        state = QValidator::Invalid; // special-case -0 will be interpreted as 0 and thus not be invalid with a range from 0-100
    } else {
        bool ok = false;
        if (displayIntegerBase != 10) {
            num = copy.toInt(&ok, displayIntegerBase);
        } else {
            num = locale.toInt(copy, &ok);
            if (!ok && (max >= 1000 || min <= -1000)) {
                const QString sep(locale.groupSeparator());
                const QString doubleSep = sep + sep;
                if (copy.contains(sep) && !copy.contains(doubleSep)) {
                    QString copy2 = copy;
                    copy2.remove(sep);
                    num = locale.toInt(copy2, &ok);
                }
            }
        }
        QSBDEBUG() << __FILE__ << __LINE__<< "num is set to" << num;
        if (!ok) {
            state = QValidator::Invalid;
        } else if (num >= min && num <= max) {
            state = QValidator::Acceptable;
        } else if (max == min) {
            state = QValidator::Invalid;
        } else {
            if ((num >= 0 && num > max) || (num < 0 && num < min)) {
                state = QValidator::Invalid;
                QSBDEBUG() << __FILE__ << __LINE__<< "state is set to Invalid";
            } else {
                state = QValidator::Intermediate;
                QSBDEBUG() << __FILE__ << __LINE__<< "state is set to Intermediate";
            }
        }
    }
    if (state != QValidator::Acceptable)
        num = max > 0 ? min : max;
    input = prefix + copy + suffix;
    cachedText = input;
    cachedState = state;
    cachedValue = QVariant((int)num);

    QSBDEBUG() << "cachedText is set to '" << cachedText << "' state is set to "
               << state << " and value is set to " << cachedValue;
    return cachedValue;
}